

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nxdnmessage.cpp
# Opt level: O2

void __thiscall DSDcc::Message::setFromSACCH(Message *this,int index,uchar *data)

{
  switch(index) {
  case 0:
    this->m_data[0] = *data;
    this->m_data[1] = data[1];
    this->m_data[2] = data[2];
    break;
  case 1:
    this->m_data[2] = *data >> 2 | this->m_data[2] & 0xc0;
    this->m_data[3] = *data << 6 | data[1] >> 2;
    this->m_data[4] = data[1] << 6 | data[2] >> 2;
    break;
  case 2:
    this->m_data[4] = *data >> 4 | this->m_data[4] & 0xf0;
    this->m_data[5] = *data << 4 | data[1] >> 4;
    this->m_data[6] = data[1] << 4 | data[2] >> 4;
    break;
  case 3:
    this->m_data[6] = *data >> 6 | this->m_data[6] & 0xfc;
    this->m_data[7] = *data << 2 | data[1] >> 6;
    this->m_data[8] = data[1] << 2 | data[2] >> 6;
  }
  this->m_shift = 0;
  return;
}

Assistant:

void Message::setFromSACCH(int index, const unsigned char *data)
{
    if (index == 0)
    {
        m_data[0] = data[0];
        m_data[1] = data[1];
        m_data[2] = data[2];
    }
    else if (index == 1)
    {
        m_data[2] = (m_data[2] & 0xC0) + (data[0]>>2);
        m_data[3] = ((data[0]&0x03)<<6) + (data[1]>>2);
        m_data[4] = ((data[1]&0x03)<<6) + (data[2]>>2);
    }
    else if (index == 2)
    {
        m_data[4] = (m_data[4] & 0xF0) + (data[0]>>4);
        m_data[5] = ((data[0]&0x0F)<<4) + (data[1]>>4);
        m_data[6] = ((data[1]&0x0F)<<4) + (data[2]>>4);
    }
    else if (index == 3)
    {
        m_data[6] = (m_data[6] & 0xFC) + (data[0]>>6);
        m_data[7] = ((data[0]&0x3F)<<2) + (data[1]>>6);
        m_data[8] = ((data[1]&0x3F)<<2) + (data[2]>>6);
    }

    m_shift = 0; // reset dual index
}